

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

void Diligent::FormatStrSS<std::__cxx11::stringstream,std::__cxx11::string,char[120]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *FirstArg,
               char (*RestArgs) [120])

{
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(ss + 0x10),(FirstArg->_M_dataplus)._M_p,FirstArg->_M_string_length);
  sVar1 = strlen(*RestArgs);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),*RestArgs,sVar1);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}